

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O1

ssize_t __thiscall
ezc3d::ParametersNS::GroupNS::Group::read(Group *this,int __fd,void *__buf,size_t __nbytes)

{
  PROCESSOR_TYPE PVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  c3d *this_00;
  uint in_R8D;
  string local_50;
  
  this_00 = (c3d *)CONCAT44(in_register_00000034,__fd);
  this->_isLocked = SUB41(in_R8D >> 0x1f,0);
  uVar3 = -in_R8D;
  if (0 < (int)in_R8D) {
    uVar3 = in_R8D;
  }
  uVar5 = 0;
  ezc3d::c3d::readString_abi_cxx11_
            (&local_50,this_00,(fstream *)__nbytes,uVar3,0,(seekdir *)&std::ios_base::cur);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  PVar1 = Parameters::processorType((Parameters *)__buf);
  sVar4 = ezc3d::c3d::readUint(this_00,PVar1,(fstream *)__nbytes,2,0,(seekdir *)&std::ios_base::cur)
  ;
  if (sVar4 != 0) {
    iVar2 = std::istream::tellg();
    uVar5 = (iVar2 + (int)sVar4) - 2;
  }
  PVar1 = Parameters::processorType((Parameters *)__buf);
  uVar3 = ezc3d::c3d::readInt(this_00,PVar1,(fstream *)__nbytes,1,0,(seekdir *)&std::ios_base::cur);
  if (uVar3 != 0) {
    ezc3d::c3d::readString_abi_cxx11_
              (&local_50,this_00,(fstream *)__nbytes,uVar3,0,(seekdir *)&std::ios_base::cur);
    std::__cxx11::string::operator=((string *)&this->_description,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return (ulong)uVar5;
}

Assistant:

int ezc3d::ParametersNS::GroupNS::Group::read(
    ezc3d::c3d &c3d, const ezc3d::ParametersNS::Parameters &params,
    std::fstream &file, int nbCharInName) {
  if (nbCharInName < 0)
    _isLocked = true;
  else
    _isLocked = false;

  // Read name of the group
  _name.assign(c3d.readString(
      file,
      static_cast<unsigned int>(abs(nbCharInName) * ezc3d::DATA_TYPE::BYTE)));

  // number of byte to the next group from here
  size_t offsetNext(
      c3d.readUint(params.processorType(), file, 2 * ezc3d::DATA_TYPE::BYTE));
  // Compute the position of the element in the file
  int nextParamByteInFile;
  if (offsetNext == 0)
    nextParamByteInFile = 0;
  else
    nextParamByteInFile = static_cast<int>(static_cast<size_t>(file.tellg()) +
                                           offsetNext - ezc3d::DATA_TYPE::WORD);

  // Byte 5+nbCharInName ==> Number of characters in group description
  int nbCharInDesc(
      c3d.readInt(params.processorType(), file, 1 * ezc3d::DATA_TYPE::BYTE));
  // Byte 6+nbCharInName ==> Group description
  if (nbCharInDesc)
    _description =
        c3d.readString(file, static_cast<unsigned int>(nbCharInDesc));

  // Return how many bytes
  return nextParamByteInFile;
}